

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aGen.hpp
# Opt level: O3

ByteCode * __thiscall
ag::Generator::FunctionManager::Get(ByteCode *__return_storage_ptr__,FunctionManager *this,size_t i)

{
  int iVar1;
  int iVar2;
  unsigned_long uVar3;
  pointer pvVar4;
  pointer pBVar5;
  unsigned_long uVar6;
  unsigned_long uVar7;
  int *piVar8;
  pointer ppVar9;
  size_t i_1;
  long lVar10;
  ulong uVar11;
  
  pBVar5 = (this->m_code).super__Vector_base<ag::ByteCode,_std::allocator<ag::ByteCode>_>._M_impl.
           super__Vector_impl_data._M_start + i;
  uVar3 = (this->m_lengthAddr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_start[i];
  iVar1 = *(int *)((long)&(pBVar5->m_bytes).
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  + 8);
  iVar2 = *(int *)&(pBVar5->m_bytes).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl;
  piVar8 = (int *)operator_new(4);
  *piVar8 = (iVar1 - (iVar2 + (int)uVar3)) + -4;
  lVar10 = 0;
  do {
    *(undefined1 *)
     (lVar10 + *(long *)&(pBVar5->m_bytes).
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl +
               uVar3) = *(undefined1 *)((long)piVar8 + lVar10);
    lVar10 = lVar10 + 1;
  } while (lVar10 != 4);
  operator_delete(piVar8,4);
  pvVar4 = (this->m_linkAddr).
           super__Vector_base<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar9 = pvVar4[i].
           super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (*(pointer *)
       ((long)&pvVar4[i].
               super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data + 8) != ppVar9) {
    uVar11 = 0;
    do {
      pBVar5 = (this->m_code).super__Vector_base<ag::ByteCode,_std::allocator<ag::ByteCode>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar3 = ppVar9[uVar11].first;
      uVar6 = ppVar9[uVar11].second;
      uVar7 = (this->m_lengthAddr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
              ._M_impl.super__Vector_impl_data._M_start[i];
      piVar8 = (int *)operator_new(4);
      *piVar8 = ((int)uVar6 - (int)uVar7) + -4;
      lVar10 = 0;
      do {
        *(undefined1 *)
         (lVar10 + *(long *)&pBVar5[i].m_bytes.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl + uVar3) = *(undefined1 *)((long)piVar8 + lVar10);
        lVar10 = lVar10 + 1;
      } while (lVar10 != 4);
      operator_delete(piVar8,4);
      uVar11 = uVar11 + 1;
      pvVar4 = (this->m_linkAddr).
               super__Vector_base<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      ppVar9 = pvVar4[i].
               super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar11 < (ulong)((long)*(pointer *)
                                     ((long)&pvVar4[i].
                                             super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                             ._M_impl.super__Vector_impl_data + 8) - (long)ppVar9 >>
                             4));
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&__return_storage_ptr__->m_bytes,
             &(this->m_code).super__Vector_base<ag::ByteCode,_std::allocator<ag::ByteCode>_>._M_impl
              .super__Vector_impl_data._M_start[i].m_bytes);
  return __return_storage_ptr__;
}

Assistant:

inline ByteCode Get(size_t i)
			{
				m_code[i].Write(m_lengthAddr[i],
					BitConverter::GetUInt32(
						m_code[i].Count() - (m_lengthAddr[i] + sizeof(uint32_t))
					)
				);

				for (size_t j = 0; j < m_linkAddr[i].size(); j++)
					m_code[i].Write(m_linkAddr[i][j].first,
						BitConverter::GetUInt32(
							m_linkAddr[i][j].second - (m_lengthAddr[i] + sizeof(uint32_t))
						)
					);

				return m_code[i];
			}